

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O1

bool __thiscall
llvm::cl::opt<(anonymous_namespace)::HelpPrinter,_true,_llvm::cl::parser<bool>_>::handleOccurrence
          (opt<(anonymous_namespace)::HelpPrinter,_true,_llvm::cl::parser<bool>_> *this,uint pos,
          StringRef ArgName,StringRef Arg)

{
  HelpPrinter *this_00;
  bool bVar1;
  parser_data_type Val;
  bool local_11;
  
  local_11 = false;
  bVar1 = parser<bool>::parse((parser<bool> *)this,&this->super_Option,ArgName,Arg,&local_11);
  if (!bVar1) {
    this_00 = (this->super_opt_storage<(anonymous_namespace)::HelpPrinter,_true,_true>).Location;
    if (this_00 == (HelpPrinter *)0x0) {
      __assert_fail("Location && \"cl::location(...) not specified for a command \" \"line option with external storage, \" \"or cl::init specified before cl::location()!!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/CommandLine.h"
                    ,0x4ad,
                    "void llvm::cl::opt_storage<(anonymous namespace)::HelpPrinter, true, true>::check_location() const [DataType = (anonymous namespace)::HelpPrinter, ExternalStorage = true, isClass = true]"
                   );
    }
    if (local_11 == true) {
      anon_unknown.dwarf_30283e::HelpPrinter::printHelp(this_00);
      exit(0);
    }
    (this->super_Option).Position = pos;
  }
  return bVar1;
}

Assistant:

bool handleOccurrence(unsigned pos, StringRef ArgName,
                        StringRef Arg) override {
    typename ParserClass::parser_data_type Val =
        typename ParserClass::parser_data_type();
    if (Parser.parse(*this, ArgName, Arg, Val))
      return true; // Parse error!
    this->setValue(Val);
    this->setPosition(pos);
    return false;
  }